

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown
          (FileDescriptorTables *this,EnumDescriptor *parent,int number)

{
  Mutex *this_00;
  ushort *puVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  string *psVar4;
  bool bVar5;
  EnumValueDescriptor *pEVar6;
  reference ppEVar7;
  DescriptorPool *pDVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  AlphaNum *c;
  size_type in_R9;
  EnumValuesByNumberSet *this_02;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  string enum_value_name;
  EnumValueDescriptor *result;
  Tables *tables;
  MutexLockMaybe l2;
  iterator it_1;
  ParentNumberQuery query;
  iterator it;
  string local_258;
  string local_238;
  string *local_218;
  EnumValueDescriptor *local_210;
  _Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false> local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  long *local_1e0 [2];
  long local_1d0 [2];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>::iterator,_bool>
  local_1c0 [2];
  iterator local_190;
  key_arg<google::protobuf::(anonymous_namespace)::ParentNumberQuery> local_180;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  local_170;
  AlphaNum local_90;
  AlphaNum local_60;
  
  pEVar6 = FindEnumValueByNumber(this,parent,number);
  if (pEVar6 == (EnumValueDescriptor *)0x0) {
    this_00 = &this->unknown_enum_values_mu_;
    local_180.query.first = parent;
    local_180.query.second = number;
    absl::lts_20250127::Mutex::ReaderLock(this_00);
    this_02 = &this->unknown_enum_values_by_number_;
    local_170.pointers_.payload_._0_16_ =
         absl::lts_20250127::container_internal::
         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
         ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                   (&this_02->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    ,&local_180);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
    ::AssertNotDebugCapacity
              (&this_02->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              );
    local_1c0[0].first.ctrl_ = (ctrl_t *)0x0;
    bVar5 = absl::lts_20250127::container_internal::operator==
                      ((iterator *)&local_170,&local_1c0[0].first);
    if (!bVar5) {
      ppEVar7 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ::iterator::operator*((iterator *)&local_170);
      pEVar6 = *ppEVar7;
    }
    absl::lts_20250127::Mutex::ReaderUnlock(this_00);
    if (bVar5) {
      absl::lts_20250127::Mutex::Lock(this_00);
      local_190 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::find<google::protobuf::(anonymous_namespace)::ParentNumberQuery>
                            (&this_02->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                             ,&local_180);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::AssertNotDebugCapacity
                (&this_02->
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                );
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_170.pointers_.payload_.
                     super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .value;
      local_170.pointers_.payload_._0_16_ = auVar3 << 0x40;
      bVar5 = absl::lts_20250127::container_internal::operator==(&local_190,(iterator *)&local_170);
      if (bVar5) {
        puVar1 = (ushort *)(parent->all_names_).payload_;
        local_1c0[0].first.ctrl_ = (ctrl_t *)(ulong)*puVar1;
        local_1c0[0].first.field_1.slot_ =
             (slot_type *)((long)puVar1 + ~(ulong)local_1c0[0].first.ctrl_);
        local_170.pointers_.payload_.
        super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .value = (PointerT<std::__cxx11::basic_string<char>_>)
                 absl::lts_20250127::str_format_internal::FormatArgImpl::
                 Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
        local_170.pointers_.payload_.super_Base<char>.value = (PointerT<char>)local_1c0;
        local_170.pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
             (PointerT<google::protobuf::SourceCodeInfo>)(ulong)(uint)number;
        local_170.pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
             (PointerT<google::protobuf::FileDescriptorTables>)
             absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
        format.size_ = (size_t)&local_170;
        format.data_ = (void *)0x18;
        args.len_ = in_R9;
        args.ptr_ = (pointer)0x2;
        c = (AlphaNum *)0x2;
        absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
                  (&local_238,(str_format_internal *)"UNKNOWN_ENUM_VALUE_%s_%d",format,args);
        pDVar8 = DescriptorPool::internal_generated_pool();
        DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
        pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
        local_208._M_head_impl =
             (pDVar8->tables_)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
        memset(&local_170,0,0xe0);
        anon_unknown_24::
        FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ::PlanArray<google::protobuf::EnumValueDescriptor>(&local_170,1);
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::PlanArray<std::__cxx11::string>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)&local_170,2);
        local_1c0[0].first.ctrl_ = (ctrl_t *)pDVar8->mutex_;
        if ((Mutex *)local_1c0[0].first.ctrl_ != (Mutex *)0x0) {
          absl::lts_20250127::Mutex::Lock((Mutex *)local_1c0[0].first.ctrl_);
        }
        (anonymous_namespace)::
        FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
        ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                  ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                    *)&local_170,&local_208._M_head_impl);
        absl::lts_20250127::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)local_1c0);
        pEVar6 = anon_unknown_24::
                 FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ::AllocateArray<google::protobuf::EnumValueDescriptor>(&local_170,1);
        pcVar2 = (parent->all_names_).payload_;
        local_1c0[0].first.ctrl_ = (ctrl_t *)(ulong)*(ushort *)(pcVar2 + 2);
        local_1c0[0].first.field_1.slot_ = (slot_type *)(pcVar2 + ~(ulong)local_1c0[0].first.ctrl_);
        local_60.piece_._M_len = 1;
        local_60.piece_._M_str = ".";
        local_90.piece_._M_len = local_238._M_string_length;
        local_90.piece_._M_str = local_238._M_dataplus._M_p;
        local_210 = pEVar6;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_258,(lts_20250127 *)local_1c0,&local_60,&local_90,c);
        this_01 = (anonymous_namespace)::
                  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  ::AllocateArray<std::__cxx11::string>
                            ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                              *)&local_170,2);
        local_1e0[0] = local_1d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1e0,local_238._M_dataplus._M_p,
                   local_238._M_dataplus._M_p + local_238._M_string_length);
        std::__cxx11::string::operator=((string *)this_01,(string *)local_1e0);
        local_200 = &local_1f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p == &local_258.field_2) {
          local_1f0._8_8_ = local_258.field_2._8_8_;
        }
        else {
          local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_258._M_dataplus._M_p;
        }
        local_1f0._M_allocated_capacity._1_7_ = local_258.field_2._M_allocated_capacity._1_7_;
        local_1f0._M_local_buf[0] = local_258.field_2._M_local_buf[0];
        local_1f8 = local_258._M_string_length;
        local_258._M_string_length = 0;
        local_258.field_2._M_local_buf[0] = '\0';
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        local_218 = this_01;
        std::__cxx11::string::operator=((string *)(this_01 + 1),(string *)&local_200);
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0._M_allocated_capacity + 1);
        }
        psVar4 = local_218;
        if (local_1e0[0] != local_1d0) {
          operator_delete(local_1e0[0],local_1d0[0] + 1);
        }
        pEVar6->all_names_ = psVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,
                          CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                   local_258.field_2._M_local_buf[0]) + 1);
        }
        pEVar6->number_ = number;
        pEVar6->type_ = parent;
        pEVar6->options_ = (EnumValueOptions *)_EnumValueOptions_default_instance_;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
        ::insert<google::protobuf::EnumValueDescriptor_*,_0>
                  (local_1c0,
                   &this_02->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                   ,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        ppEVar7 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ::iterator::operator*(&local_190);
        pEVar6 = *ppEVar7;
      }
      absl::lts_20250127::Mutex::Unlock(this_00);
    }
  }
  return pEVar6;
}

Assistant:

inline const EnumValueDescriptor*
FileDescriptorTables::FindEnumValueByNumberCreatingIfUnknown(
    const EnumDescriptor* parent, int number) const {
  // First try, with map of compiled-in values.
  {
    const auto* value = FindEnumValueByNumber(parent, number);
    if (value != nullptr) {
      return value;
    }
  }

  const ParentNumberQuery query{{parent, number}};

  // Second try, with reader lock held on unknown enum values: common case.
  {
    absl::ReaderMutexLock l(&unknown_enum_values_mu_);
    auto it = unknown_enum_values_by_number_.find(query);
    if (it != unknown_enum_values_by_number_.end()) {
      return *it;
    }
  }
  // If not found, try again with writer lock held, and create new descriptor if
  // necessary.
  {
    absl::WriterMutexLock l(&unknown_enum_values_mu_);
    auto it = unknown_enum_values_by_number_.find(query);
    if (it != unknown_enum_values_by_number_.end()) {
      return *it;
    }

    // Create an EnumValueDescriptor dynamically. We don't insert it into the
    // EnumDescriptor (it's not a part of the enum as originally defined), but
    // we do insert it into the table so that we can return the same pointer
    // later.
    std::string enum_value_name =
        absl::StrFormat("UNKNOWN_ENUM_VALUE_%s_%d", parent->name(), number);
    auto* pool = DescriptorPool::generated_pool();
    auto* tables = const_cast<DescriptorPool::Tables*>(pool->tables_.get());
    internal::FlatAllocator alloc;
    alloc.PlanArray<EnumValueDescriptor>(1);
    alloc.PlanArray<std::string>(2);

    {
      // Must lock the pool because we will do allocations in the shared arena.
      absl::MutexLockMaybe l2(pool->mutex_);
      alloc.FinalizePlanning(tables);
    }
    EnumValueDescriptor* result = alloc.AllocateArray<EnumValueDescriptor>(1);
    result->all_names_ = alloc.AllocateStrings(
        enum_value_name,
        absl::StrCat(parent->full_name(), ".", enum_value_name));
    result->number_ = number;
    result->type_ = parent;
    result->options_ = &EnumValueOptions::default_instance();
    unknown_enum_values_by_number_.insert(result);
    return result;
  }
}